

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O1

void __thiscall
draco::TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace
          (TriangleSoupMeshBuilder *this,int att_id,FaceIndex face_id,void *value)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  Face local_3c;
  
  lVar3 = (long)att_id;
  puVar1 = *(undefined8 **)
            (*(long *)&(((this->mesh_)._M_t.
                         super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                         super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                         super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl)->super_PointCloud
                       ).attributes_.
                       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                       ._M_impl + lVar3 * 8);
  memcpy((void *)(puVar1[5] * (ulong)(face_id.value_ * 3) + *(long *)*puVar1),value,puVar1[5]);
  uVar4 = face_id.value_ * 3 + 1;
  memcpy((void *)(puVar1[5] * (ulong)uVar4 + *(long *)*puVar1),value,puVar1[5]);
  uVar5 = face_id.value_ * 3 + 2;
  memcpy((void *)(puVar1[5] * (ulong)uVar5 + *(long *)*puVar1),value,puVar1[5]);
  local_3c._M_elems[0].value_ = face_id.value_ * 3;
  local_3c._M_elems[1].value_ = uVar4;
  local_3c._M_elems[2].value_ = uVar5;
  Mesh::SetFace((this->mesh_)._M_t.
                super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl,face_id,&local_3c);
  pcVar2 = (this->attribute_element_types_).
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2[lVar3] < '\0') {
    pcVar2[lVar3] = '\x02';
  }
  return;
}

Assistant:

void TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace(
    int att_id, FaceIndex face_id, const void *value) {
  const int start_index = 3 * face_id.value();
  PointAttribute *const att = mesh_->attribute(att_id);
  att->SetAttributeValue(AttributeValueIndex(start_index), value);
  att->SetAttributeValue(AttributeValueIndex(start_index + 1), value);
  att->SetAttributeValue(AttributeValueIndex(start_index + 2), value);
  mesh_->SetFace(face_id,
                 {{PointIndex(start_index), PointIndex(start_index + 1),
                   PointIndex(start_index + 2)}});
  int8_t &element_type = attribute_element_types_[att_id];
  if (element_type < 0) {
    element_type = MESH_FACE_ATTRIBUTE;
  }
}